

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O0

char_class_type
boost::xpressive::cpp_regex_traits<char>::
lookup_classname_impl_<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 end)

{
  bool bVar1;
  char_class_pair *pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RSI;
  char_type *in_RDI;
  size_t j;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_00;
  
  end_00._M_current = (char *)0x0;
  while( true ) {
    pcVar2 = char_class((size_t)end_00._M_current);
    if (pcVar2->class_name_ == (char_type *)0x0) {
      return 0;
    }
    char_class((size_t)end_00._M_current);
    bVar1 = compare_<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(in_RDI,in_RSI,end_00)
    ;
    if (bVar1) break;
    end_00._M_current = end_00._M_current + 1;
  }
  pcVar2 = char_class((size_t)end_00._M_current);
  return pcVar2->class_type_;
}

Assistant:

static char_class_type lookup_classname_impl_(FwdIter begin, FwdIter end)
    {
        // find the classname
        typedef cpp_regex_traits<Char> this_t;
        for(std::size_t j = 0; 0 != this_t::char_class(j).class_name_; ++j)
        {
            if(this_t::compare_(this_t::char_class(j).class_name_, begin, end))
            {
                return this_t::char_class(j).class_type_;
            }
        }
        return 0;
    }